

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructNew *curr)

{
  size_t sVar1;
  long *plVar2;
  long lVar3;
  Literal *pLVar4;
  ulong uVar5;
  Type this_00;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  HeapType heapType;
  Literal local_d0;
  Literal local_b8;
  undefined1 local_a0 [8];
  Literals data;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id != 1) {
    data.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type;
    Type::getHeapType((Type *)data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    plVar2 = (long *)::wasm::HeapType::getStruct();
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)local_a0,plVar2[1] - *plVar2 >> 4);
    lVar3 = *plVar2;
    if (plVar2[1] != lVar3) {
      uVar5 = 1;
      uVar8 = 0;
      do {
        uVar7 = uVar5;
        iVar6 = (int)uVar7;
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            == 0) {
          ::wasm::Literal::makeZero((Type)&heapType);
          pLVar4 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   uVar8 * 0x18);
          if (iVar6 == 1) {
            pLVar4 = (Literal *)&data;
          }
          ::wasm::Literal::operator=(pLVar4,(Literal *)&heapType);
          this_00.id = (uintptr_t)&heapType;
        }
        else {
          if ((curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar8) goto LAB_001c2049;
          visit(__return_storage_ptr__,this,
                (curr->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                [uVar8]);
          if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
          goto LAB_001c2012;
          pLVar4 = Flow::getSingleValue(__return_storage_ptr__);
          ::wasm::Literal::Literal(&local_d0,pLVar4);
          truncateForPacking((Literal *)&heapType,this,&local_d0,(Field *)(uVar8 * 0x10 + lVar3));
          pLVar4 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   uVar8 * 0x18);
          if (iVar6 == 1) {
            pLVar4 = (Literal *)&data;
          }
          ::wasm::Literal::operator=(pLVar4,(Literal *)&heapType);
          ::wasm::Literal::~Literal((Literal *)&heapType);
          ::wasm::Literal::~Literal(&local_d0);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                      flexible);
          this_00.id = (uintptr_t)
                       &(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed
          ;
        }
        ::wasm::Literal::~Literal((Literal *)this_00.id);
        lVar3 = *plVar2;
        uVar5 = (ulong)(iVar6 + 1);
        uVar8 = uVar7;
      } while (uVar7 < (ulong)(plVar2[1] - lVar3 >> 4));
    }
    makeGCData(&local_b8,this,(Literals *)local_a0,
               (Type)((data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->field_0).i64);
    Flow::Flow(__return_storage_ptr__,&local_b8);
    ::wasm::Literal::~Literal(&local_b8);
LAB_001c2012:
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    ::wasm::Literal::~Literal((Literal *)&data);
    return __return_storage_ptr__;
  }
  sVar1 = (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  bVar9 = sVar1 == 0;
  if (!bVar9) {
    uVar5 = 0;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar5) {
LAB_001c2049:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      visit(__return_storage_ptr__,this,
            (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar5]);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
        if (!bVar9) {
          return __return_storage_ptr__;
        }
        break;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible);
      ::wasm::Literal::~Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems);
      uVar5 = uVar5 + 1;
      bVar9 = sVar1 == uVar5;
    } while (!bVar9);
  }
  ::wasm::handle_unreachable
            ("unreachable but no unreachable child",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
             ,0x6c2);
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return makeGCData(std::move(data), curr->type);
  }